

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gregocal.cpp
# Opt level: O0

void __thiscall
icu_63::GregorianCalendar::GregorianCalendar
          (GregorianCalendar *this,TimeZone *zone,Locale *aLocale,UErrorCode *status)

{
  UDate millis;
  UErrorCode *status_local;
  Locale *aLocale_local;
  TimeZone *zone_local;
  GregorianCalendar *this_local;
  
  Calendar::Calendar(&this->super_Calendar,zone,aLocale,status);
  (this->super_Calendar).super_UObject._vptr_UObject =
       (_func_int **)&PTR__GregorianCalendar_004ea7a8;
  this->fGregorianCutover = -12219292800000.0;
  this->fCutoverJulianDay = 0x231519;
  this->fNormalizedGregorianCutover = this->fGregorianCutover;
  this->fGregorianCutoverYear = 0x62e;
  this->fIsGregorian = '\x01';
  this->fInvertGregorian = '\0';
  millis = Calendar::getNow();
  Calendar::setTimeInMillis(&this->super_Calendar,millis,status);
  return;
}

Assistant:

GregorianCalendar::GregorianCalendar(TimeZone* zone, const Locale& aLocale,
                                     UErrorCode& status)
                                     :   Calendar(zone, aLocale, status),
                                     fGregorianCutover(kPapalCutover),
                                     fCutoverJulianDay(kCutoverJulianDay), fNormalizedGregorianCutover(fGregorianCutover), fGregorianCutoverYear(1582),
                                     fIsGregorian(TRUE), fInvertGregorian(FALSE)
{
    setTimeInMillis(getNow(), status);
}